

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O2

int __thiscall ncnn::Convolution::create_requantize_op(Convolution *this)

{
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *this_00;
  float fVar1;
  Convolution *pCVar2;
  vector<float,_std::allocator<float>_> *this_01;
  int iVar3;
  Layer *pLVar4;
  long lVar5;
  float scale_out;
  float scale_in;
  Convolution *local_668;
  vector<float,_std::allocator<float>_> *local_660;
  Mat local_658;
  Mat weights [1];
  ParamDict pd;
  
  if (this->use_int8_requantize == false) {
    fwrite("requantized op set but use_int8_requantize disabled\n",0x34,1,_stderr);
    iVar3 = -1;
  }
  else {
    this_00 = &this->requantize_ops;
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
              (this_00,(long)this->num_output);
    local_660 = &this->requantize_scales;
    local_668 = this;
    for (lVar5 = 0; pCVar2 = local_668, lVar5 < local_668->num_output; lVar5 = lVar5 + 1) {
      pLVar4 = create_layer(0x3f);
      (pCVar2->requantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar5] = pLVar4;
      fVar1 = *(float *)((long)(pCVar2->weight_data_int8_scales).data + lVar5 * 4);
      scale_in = (float)(~-(uint)(fVar1 == 0.0) &
                        (uint)(1.0 / (pCVar2->bottom_blob_int8_scale * fVar1)));
      scale_out = pCVar2->top_blob_int8_scale;
      ParamDict::ParamDict(&pd);
      ParamDict::set(&pd,0,scale_in);
      ParamDict::set(&pd,1,scale_out);
      ParamDict::set(&pd,2,pCVar2->bias_term);
      ParamDict::set(&pd,3,1);
      pLVar4 = (this_00->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
               super__Vector_impl_data._M_start[lVar5];
      (*pLVar4->_vptr_Layer[2])(pLVar4,&pd);
      weights[0].elemsize._0_4_ = 0;
      weights[0]._20_8_ = 0;
      weights[0].data = (void *)0x0;
      weights[0].refcount._0_4_ = 0;
      weights[0].refcount._4_4_ = 0;
      weights[0].h = 0;
      weights[0].c = 0;
      weights[0].cstep = 0;
      weights[0].allocator = (Allocator *)0x0;
      weights[0].dims = 0;
      weights[0].w = 0;
      local_658.elemsize = (pCVar2->bias_data).elemsize;
      local_658.data = (void *)(local_658.elemsize * lVar5 + (long)(pCVar2->bias_data).data);
      local_658.packing = (pCVar2->bias_data).packing;
      local_658.allocator = (pCVar2->bias_data).allocator;
      local_658.refcount = (int *)0x0;
      local_658.dims = 1;
      local_658.w = 1;
      local_658.h = 1;
      local_658.c = 1;
      local_658.cstep = 1;
      Mat::operator=(weights,&local_658);
      Mat::~Mat(&local_658);
      pLVar4 = (this_00->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
               super__Vector_impl_data._M_start[lVar5];
      ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_658,weights);
      (*pLVar4->_vptr_Layer[3])(pLVar4,&local_658);
      this_01 = local_660;
      std::vector<float,_std::allocator<float>_>::push_back(local_660,&scale_in);
      std::vector<float,_std::allocator<float>_>::push_back(this_01,&scale_out);
      Mat::~Mat(weights);
      ParamDict::~ParamDict(&pd);
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int Convolution::create_requantize_op(void)
{
    if (!use_int8_requantize)
    {
        fprintf(stderr, "requantized op set but use_int8_requantize disabled\n");
        return -1;
    }

    requantize_ops.resize(num_output);
    for (int n=0; n<num_output; n++)
    {
        requantize_ops[n] = ncnn::create_layer(ncnn::LayerType::Requantize);

        float scale_in = 1.f;
        float scale_out = 1.f;

        if (weight_data_int8_scales[n] == 0)
        {
            scale_in = 0;
        }
        else
        {
            scale_in = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[n]);
        }

        scale_out = top_blob_int8_scale;

        ncnn::ParamDict pd;
        pd.set(0, scale_in);   // scale in
        pd.set(1, scale_out);  // scale_out
        pd.set(2, bias_term);  // bias_term
        pd.set(3, 1);          // bias_data_size

        requantize_ops[n]->load_param(pd);

        ncnn::Mat weights[1];
        weights[0] = bias_data.range(n, 1);

        requantize_ops[n]->load_model(ModelBinFromMatArray(weights));

        requantize_scales.push_back(scale_in);
        requantize_scales.push_back(scale_out);
    }

    return 0;
}